

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_CutDsdPermLitMax(char *pPermLits,int nVars,int iVar)

{
  int iVar1;
  ulong uVar2;
  
  if ((-1 < iVar) && (iVar < nVars)) {
    uVar2 = 0;
    while( true ) {
      if ((uint)nVars == uVar2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x8b0,"int If_CutDsdPermLitMax(char *, int, int)");
      }
      iVar1 = Abc_Lit2Var((int)pPermLits[uVar2]);
      if (iVar1 == iVar) break;
      uVar2 = uVar2 + 1;
    }
    return (int)uVar2;
  }
  __assert_fail("iVar >= 0 && iVar < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x8ac,"int If_CutDsdPermLitMax(char *, int, int)");
}

Assistant:

int If_CutDsdPermLitMax( char * pPermLits, int nVars, int iVar )
{
    int i;
    assert( iVar >= 0 && iVar < nVars );
    for ( i = 0; i < nVars; i++ )
        if ( iVar == Abc_Lit2Var((int)pPermLits[i]) )
            return i;
    assert( 0 );
    return -1;
}